

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

_Bool checkhttpprefix(Curl_easy *data,char *s)

{
  char *__s;
  int iVar1;
  size_t max;
  _Bool _Var2;
  _Bool _Var3;
  curl_slist *pcVar4;
  
  pcVar4 = (data->set).http200aliases;
  do {
    if (pcVar4 == (curl_slist *)0x0) {
      _Var2 = false;
LAB_00113931:
      _Var3 = _Var2;
      if (_Var2 == false) {
        iVar1 = curl_strnequal("HTTP/",s,5);
        _Var3 = true;
        if (iVar1 == 0) {
          _Var3 = _Var2;
        }
      }
      return _Var3;
    }
    __s = pcVar4->data;
    max = strlen(__s);
    iVar1 = curl_strnequal(__s,s,max);
    if (iVar1 != 0) {
      _Var2 = true;
      goto LAB_00113931;
    }
    pcVar4 = pcVar4->next;
  } while( true );
}

Assistant:

static bool
checkhttpprefix(struct Curl_easy *data,
                const char *s)
{
  struct curl_slist *head = data->set.http200aliases;
  bool rc = FALSE;
#ifdef CURL_DOES_CONVERSIONS
  /* convert from the network encoding using a scratch area */
  char *scratch = strdup(s);
  if(NULL == scratch) {
    failf(data, "Failed to allocate memory for conversion!");
    return FALSE; /* can't return CURLE_OUT_OF_MEMORY so return FALSE */
  }
  if(CURLE_OK != Curl_convert_from_network(data, scratch, strlen(s) + 1)) {
    /* Curl_convert_from_network calls failf if unsuccessful */
    free(scratch);
    return FALSE; /* can't return CURLE_foobar so return FALSE */
  }
  s = scratch;
#endif /* CURL_DOES_CONVERSIONS */

  while(head) {
    if(checkprefix(head->data, s)) {
      rc = TRUE;
      break;
    }
    head = head->next;
  }

  if(!rc && (checkprefix("HTTP/", s)))
    rc = TRUE;

#ifdef CURL_DOES_CONVERSIONS
  free(scratch);
#endif /* CURL_DOES_CONVERSIONS */
  return rc;
}